

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O2

void scriptnum_tests::CheckCreateVch(int64_t *num)

{
  long lVar1;
  int iVar2;
  undefined1 **ppuVar3;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  check_type cVar6;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  CScriptNum scriptnum3;
  CScriptNum10 bignum3;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  CScriptNum scriptnum2;
  CScriptNum10 bignum2;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  char **local_88;
  assertion_result local_80;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  CScriptNum scriptnum;
  CScriptNum10 bignum;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  scriptnum.m_value = *num;
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_50 = "";
  ppuVar3 = &local_68;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1e;
  file.m_begin = (iterator)&local_58;
  bignum.m_value = scriptnum.m_value;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar3,msg);
  iVar2 = verify((EVP_PKEY_CTX *)&bignum,(uchar *)&scriptnum,siglen,(uchar *)ppuVar3,(size_t)in_R8);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = "verify(bignum, scriptnum)";
  local_a8 = "";
  local_a0[8] = false;
  local_a0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_b8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar6,(size_t)&local_c0,0x1e);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  CScriptNum10::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,&bignum.m_value);
  CScriptNum10::CScriptNum10
            (&bignum2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,false,4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  CScriptNum::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,&scriptnum.m_value);
  CScriptNum::CScriptNum
            (&scriptnum2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,false,4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_d8 = "";
  ppuVar3 = &local_f0;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = &DAT_00000022;
  file_00.m_begin = (iterator)&local_e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar3,msg_00);
  iVar2 = verify((EVP_PKEY_CTX *)&bignum2,(uchar *)&scriptnum2,siglen_00,(uchar *)ppuVar3,
                 (size_t)pvVar4);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = "verify(bignum2, scriptnum2)";
  local_a8 = "";
  local_a0[8] = false;
  local_a0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_f8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar6,(size_t)&local_100,0x22);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  CScriptNum::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,&scriptnum2.m_value);
  CScriptNum10::CScriptNum10
            (&bignum3,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,false,4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  CScriptNum10::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,&bignum2.m_value);
  CScriptNum::CScriptNum
            (&scriptnum3,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,false,4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_118 = "";
  ppuVar3 = &local_130;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x26;
  file_01.m_begin = (iterator)&local_120;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar3,msg_01);
  iVar2 = verify((EVP_PKEY_CTX *)&bignum3,(uchar *)&scriptnum3,siglen_01,(uchar *)ppuVar3,
                 (size_t)pvVar4);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = "verify(bignum3, scriptnum3)";
  local_a8 = "";
  local_a0[8] = false;
  local_a0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,0xc04380,(size_t)&stack0xfffffffffffffec0,
             0x26);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckCreateVch(const int64_t& num)
{
    CScriptNum10 bignum(num);
    CScriptNum scriptnum(num);
    BOOST_CHECK(verify(bignum, scriptnum));

    CScriptNum10 bignum2(bignum.getvch(), false);
    CScriptNum scriptnum2(scriptnum.getvch(), false);
    BOOST_CHECK(verify(bignum2, scriptnum2));

    CScriptNum10 bignum3(scriptnum2.getvch(), false);
    CScriptNum scriptnum3(bignum2.getvch(), false);
    BOOST_CHECK(verify(bignum3, scriptnum3));
}